

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

size_t __thiscall OpenMesh::PropertyT<char>::store(PropertyT<char> *this,ostream *_ostr,bool _swap)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  ulong uVar2;
  size_t sVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])
                    (this,_ostr,CONCAT71(in_register_00000011,_swap));
  if (CONCAT44(extraout_var,iVar1) == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = 0;
    sVar3 = 0;
    do {
      uStack_38 = CONCAT17((this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar2],(undefined7)uStack_38);
      std::ostream::write((char *)_ostr,(long)&uStack_38 + 7);
      sVar3 = sVar3 + (*(int *)(&_ostr->field_0x20 + (long)_ostr->_vptr_basic_ostream[-3]) == 0);
      uVar2 = uVar2 + 1;
      iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
    } while (uVar2 < CONCAT44(extraout_var_00,iVar1));
  }
  return sVar3;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }